

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QHostAddress>::emplace<QHostAddress_const&>
          (QMovableArrayOps<QHostAddress> *this,qsizetype i,QHostAddress *args)

{
  QHostAddress **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  QHostAddress QVar5;
  qsizetype qVar6;
  long in_FS_OFFSET;
  bool bVar7;
  Inserter IStack_58;
  QHostAddress tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QHostAddress>).super_QArrayDataPointer<QHostAddress>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QHostAddress>).super_QArrayDataPointer<QHostAddress>.size == i
       ) {
      qVar6 = QArrayDataPointer<QHostAddress>::freeSpaceAtEnd
                        ((QArrayDataPointer<QHostAddress> *)this);
      if (qVar6 == 0) goto LAB_001a5430;
      QHostAddress::QHostAddress
                ((this->super_QGenericArrayOps<QHostAddress>).super_QArrayDataPointer<QHostAddress>.
                 ptr + (this->super_QGenericArrayOps<QHostAddress>).
                       super_QArrayDataPointer<QHostAddress>.size,args);
LAB_001a551a:
      pqVar2 = &(this->super_QGenericArrayOps<QHostAddress>).super_QArrayDataPointer<QHostAddress>.
                size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_001a54d9;
    }
LAB_001a5430:
    if (i == 0) {
      qVar6 = QArrayDataPointer<QHostAddress>::freeSpaceAtBegin
                        ((QArrayDataPointer<QHostAddress> *)this);
      if (qVar6 != 0) {
        QHostAddress::QHostAddress
                  ((this->super_QGenericArrayOps<QHostAddress>).
                   super_QArrayDataPointer<QHostAddress>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QHostAddress>).
                   super_QArrayDataPointer<QHostAddress>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_001a551a;
      }
    }
  }
  tmp.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress(&tmp,args);
  bVar7 = (this->super_QGenericArrayOps<QHostAddress>).super_QArrayDataPointer<QHostAddress>.size !=
          0;
  QArrayDataPointer<QHostAddress>::detachAndGrow
            ((QArrayDataPointer<QHostAddress> *)this,(uint)(i == 0 && bVar7),1,(QHostAddress **)0x0,
             (QArrayDataPointer<QHostAddress> *)0x0);
  QVar5 = tmp;
  if (i == 0 && bVar7) {
    tmp.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)
                  (totally_ordered_wrapper<QHostAddressPrivate_*>)0x0;
    (this->super_QGenericArrayOps<QHostAddress>).super_QArrayDataPointer<QHostAddress>.ptr[-1].d.d.
    ptr = (QHostAddressPrivate *)QVar5.d.d.ptr;
    ppQVar1 = &(this->super_QGenericArrayOps<QHostAddress>).super_QArrayDataPointer<QHostAddress>.
               ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QHostAddress>).super_QArrayDataPointer<QHostAddress>.
              size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&IStack_58,(QArrayDataPointer<QHostAddress> *)this,i,1);
    QVar5 = tmp;
    tmp.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)
                  (totally_ordered_wrapper<QHostAddressPrivate_*>)0x0;
    ((IStack_58.displaceFrom)->d).d.ptr = (QHostAddressPrivate *)QVar5.d.d.ptr;
    IStack_58.displaceFrom = IStack_58.displaceFrom + 1;
    Inserter::~Inserter(&IStack_58);
  }
  QHostAddress::~QHostAddress(&tmp);
LAB_001a54d9:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }